

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2streams.cpp
# Opt level: O3

void __thiscall Http2::Stream::Stream(Stream *this,QString *cacheKey,quint32 id,qint32 recvSize)

{
  Data *pDVar1;
  
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*,_false>(&this->httpPair);
  this->streamID = id;
  this->sendWindow = 0xffff;
  this->recvWindow = recvSize;
  this->state = remoteReserved;
  pDVar1 = (cacheKey->d).d;
  (this->key).d.d = pDVar1;
  (this->key).d.ptr = (cacheKey->d).ptr;
  (this->key).d.size = (cacheKey->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

Stream::Stream(const QString &cacheKey, quint32 id, qint32 recvSize)
    : streamID(id),
      // sendWindow is 0, this stream only receives data
      recvWindow(recvSize),
      state(remoteReserved),
      key(cacheKey)
{
}